

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

uint utf8_text_width(string *str)

{
  wchar_t ucs;
  int iVar1;
  uint uVar2;
  bool bVar3;
  size_type i;
  size_type local_28;
  
  local_28 = 0;
  ucs = utf8_next_char(str,&local_28);
  if (ucs == L'\0') {
    uVar2 = 0;
  }
  else {
    bVar3 = false;
    uVar2 = 0;
    do {
      if (bVar3) {
        bVar3 = ucs != L'm';
      }
      else {
        bVar3 = true;
        if (ucs != L'\x1b') {
          iVar1 = mk_wcwidth(ucs);
          uVar2 = uVar2 + iVar1;
          bVar3 = false;
        }
      }
      ucs = utf8_next_char(str,&local_28);
    } while (ucs != L'\0');
  }
  return uVar2;
}

Assistant:

unsigned int utf8_text_width (const std::string& str)
{
  bool in_color = false;

  unsigned int length = 0;
  std::string::size_type i = 0;
  unsigned int c;
  while ((c = utf8_next_char (str, i)))
  {
    if (in_color)
    {
      if (c == 'm')
        in_color = false;
    }
    else if (c == 033)
    {
      in_color = true;
    }
    else
      length += mk_wcwidth (c);
  }

  return length;
}